

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_decode_data_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::
ObjCHelper_TextFormatDecodeData_DecodeDataForString_RawStrings_Test::
~ObjCHelper_TextFormatDecodeData_DecodeDataForString_RawStrings_Test
          (ObjCHelper_TextFormatDecodeData_DecodeDataForString_RawStrings_Test *this)

{
  ObjCHelper_TextFormatDecodeData_DecodeDataForString_RawStrings_Test *this_local;
  
  ~ObjCHelper_TextFormatDecodeData_DecodeDataForString_RawStrings_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjCHelper, TextFormatDecodeData_DecodeDataForString_RawStrings) {
  std::string input_for_decode("abcdefghIJ");
  std::string desired_output_for_decode;
  std::string expected;
  std::string result;

  // Different data, can't transform.

  desired_output_for_decode = "zbcdefghIJ";
  expected = std::string("\0zbcdefghIJ\0", 12);
  result = TextFormatDecodeData::DecodeDataForString(input_for_decode,
                                                     desired_output_for_decode);
  EXPECT_EQ(expected, result);

  desired_output_for_decode = "abcdezghIJ";
  expected = std::string("\0abcdezghIJ\0", 12);
  result = TextFormatDecodeData::DecodeDataForString(input_for_decode,
                                                     desired_output_for_decode);
  EXPECT_EQ(expected, result);

  // Shortened data, can't transform.

  desired_output_for_decode = "abcdefghI";
  expected = std::string("\0abcdefghI\0", 11);
  result = TextFormatDecodeData::DecodeDataForString(input_for_decode,
                                                     desired_output_for_decode);
  EXPECT_EQ(expected, result);

  // Extra data, can't transform.

  desired_output_for_decode = "abcdefghIJz";
  expected = std::string("\0abcdefghIJz\0", 13);
  result = TextFormatDecodeData::DecodeDataForString(input_for_decode,
                                                     desired_output_for_decode);
  EXPECT_EQ(expected, result);
}